

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_node __thiscall
pugi::xml_node::insert_copy_before(xml_node *this,xml_node *proto,xml_node *node)

{
  xml_node xVar1;
  xml_node_type type_;
  xml_node result;
  xml_node local_18;
  
  if (proto->_root == (xml_node_struct *)0x0) {
    type_ = node_null;
  }
  else {
    type_ = ((uint)proto->_root->header & 7) + node_document;
  }
  xVar1 = insert_child_before(this,type_,node);
  if (xVar1._root != (xml_node_struct *)0x0) {
    local_18 = xVar1;
    impl::anon_unknown_0::recursive_copy_skip(&local_18,proto,&local_18);
  }
  return (xml_node)xVar1._root;
}

Assistant:

PUGI__FN xml_node xml_node::insert_copy_before(const xml_node& proto, const xml_node& node)
	{
		xml_node result = insert_child_before(proto.type(), node);

		if (result) impl::recursive_copy_skip(result, proto, result);

		return result;
	}